

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,TimeZone *tz,UDate date,
          UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  UBool UVar1;
  int offset_00;
  UTimeZoneFormatTimeType UVar2;
  int local_54;
  int32_t offset;
  int32_t dstOffset;
  int32_t rawOffset;
  UErrorCode status;
  UChar *shortID;
  UTimeZoneFormatTimeType *pUStack_38;
  UBool noOffsetFormatFallback;
  UTimeZoneFormatTimeType *timeType_local;
  UnicodeString *name_local;
  UDate date_local;
  TimeZone *tz_local;
  TimeZoneFormat *pTStack_10;
  UTimeZoneFormatStyle style_local;
  TimeZoneFormat *this_local;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  shortID._7_1_ = '\0';
  pUStack_38 = timeType;
  timeType_local = (UTimeZoneFormatTimeType *)name;
  name_local = (UnicodeString *)date;
  date_local = (UDate)tz;
  tz_local._4_4_ = style;
  pTStack_10 = this;
  switch(style) {
  case UTZFMT_STYLE_GENERIC_LOCATION:
    formatGeneric(this,tz,1,date,name);
    break;
  case UTZFMT_STYLE_GENERIC_LONG:
    formatGeneric(this,tz,2,date,name);
    break;
  case UTZFMT_STYLE_GENERIC_SHORT:
    formatGeneric(this,tz,4,date,name);
    break;
  case UTZFMT_STYLE_SPECIFIC_LONG:
    formatSpecific(this,tz,UTZNM_LONG_STANDARD,UTZNM_LONG_DAYLIGHT,date,name,timeType);
    break;
  case UTZFMT_STYLE_SPECIFIC_SHORT:
    formatSpecific(this,tz,UTZNM_SHORT_STANDARD,UTZNM_SHORT_DAYLIGHT,date,name,timeType);
    break;
  default:
    break;
  case UTZFMT_STYLE_ZONE_ID:
    TimeZone::getID(tz,name);
    shortID._7_1_ = '\x01';
    break;
  case UTZFMT_STYLE_ZONE_ID_SHORT:
    _rawOffset = ZoneMeta::getShortID(tz);
    if (_rawOffset == (UChar *)0x0) {
      _rawOffset = L"unk";
    }
    UnicodeString::setTo((UnicodeString *)timeType_local,_rawOffset,-1);
    shortID._7_1_ = '\x01';
    break;
  case UTZFMT_STYLE_EXEMPLAR_LOCATION:
    formatExemplarLocation(this,tz,name);
    shortID._7_1_ = '\x01';
  }
  UVar1 = UnicodeString::isEmpty((UnicodeString *)timeType_local);
  if ((UVar1 != '\0') && (shortID._7_1_ == '\0')) {
    dstOffset = 0;
    (**(code **)(*(long *)date_local + 0x30))(name_local,date_local,0,&offset,&local_54);
    offset_00 = offset + local_54;
    UVar1 = ::U_SUCCESS(dstOffset);
    if (UVar1 != '\0') {
      switch(tz_local._4_4_) {
      case UTZFMT_STYLE_GENERIC_LOCATION:
      case UTZFMT_STYLE_GENERIC_LONG:
      case UTZFMT_STYLE_SPECIFIC_LONG:
      case UTZFMT_STYLE_LOCALIZED_GMT:
        formatOffsetLocalizedGMT(this,offset_00,(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_GENERIC_SHORT:
      case UTZFMT_STYLE_SPECIFIC_SHORT:
      case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
        formatOffsetShortLocalizedGMT(this,offset_00,(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_SHORT:
        formatOffsetISO8601Basic
                  (this,offset_00,'\x01','\x01','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
        formatOffsetISO8601Basic
                  (this,offset_00,'\0','\x01','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_FIXED:
        formatOffsetISO8601Basic
                  (this,offset_00,'\x01','\0','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
        formatOffsetISO8601Basic
                  (this,offset_00,'\0','\0','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_FULL:
        formatOffsetISO8601Basic
                  (this,offset_00,'\x01','\0','\0',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
        formatOffsetISO8601Basic
                  (this,offset_00,'\0','\0','\0',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
        formatOffsetISO8601Extended
                  (this,offset_00,'\x01','\0','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
        formatOffsetISO8601Extended
                  (this,offset_00,'\0','\0','\x01',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_EXTENDED_FULL:
        formatOffsetISO8601Extended
                  (this,offset_00,'\x01','\0','\0',(UnicodeString *)timeType_local,&dstOffset);
        break;
      case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
        formatOffsetISO8601Extended
                  (this,offset_00,'\0','\0','\0',(UnicodeString *)timeType_local,&dstOffset);
      }
      if (pUStack_38 != (UTimeZoneFormatTimeType *)0x0) {
        UVar2 = UTZFMT_TIME_TYPE_STANDARD;
        if (local_54 != 0) {
          UVar2 = UTZFMT_TIME_TYPE_DAYLIGHT;
        }
        *pUStack_38 = UVar2;
      }
    }
  }
  return (UnicodeString *)timeType_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(UTimeZoneFormatStyle style, const TimeZone& tz, UDate date,
        UnicodeString& name, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    UBool noOffsetFormatFallback = FALSE;

    switch (style) {
    case UTZFMT_STYLE_GENERIC_LOCATION:
        formatGeneric(tz, UTZGNM_LOCATION, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_LONG:
        formatGeneric(tz, UTZGNM_LONG, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_SHORT:
        formatGeneric(tz, UTZGNM_SHORT, date, name);
        break;
    case UTZFMT_STYLE_SPECIFIC_LONG:
        formatSpecific(tz, UTZNM_LONG_STANDARD, UTZNM_LONG_DAYLIGHT, date, name, timeType);
        break;
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        formatSpecific(tz, UTZNM_SHORT_STANDARD, UTZNM_SHORT_DAYLIGHT, date, name, timeType);
        break;

    case UTZFMT_STYLE_ZONE_ID:
        tz.getID(name);
        noOffsetFormatFallback = TRUE;
        break;
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            const UChar* shortID = ZoneMeta::getShortID(tz);
            if (shortID == NULL) {
                shortID = UNKNOWN_SHORT_ZONE_ID;
            }
            name.setTo(shortID, -1);
        }
        noOffsetFormatFallback = TRUE;
        break;

    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        formatExemplarLocation(tz, name);
        noOffsetFormatFallback = TRUE;
        break;

    default:
        // will be handled below
        break;
    }

    if (name.isEmpty() && !noOffsetFormatFallback) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t rawOffset, dstOffset;
        tz.getOffset(date, FALSE, rawOffset, dstOffset, status);
        int32_t offset = rawOffset + dstOffset;
        if (U_SUCCESS(status)) {
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
            case UTZFMT_STYLE_GENERIC_LONG:
            case UTZFMT_STYLE_SPECIFIC_LONG:
            case UTZFMT_STYLE_LOCALIZED_GMT:
                formatOffsetLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
            case UTZFMT_STYLE_SPECIFIC_SHORT:
            case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
                formatOffsetShortLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_SHORT:
                formatOffsetISO8601Basic(offset, TRUE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
                formatOffsetISO8601Basic(offset, FALSE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FIXED:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FULL:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FULL:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, FALSE, name, status);
                break;

            default:
              // UTZFMT_STYLE_ZONE_ID, UTZFMT_STYLE_ZONE_ID_SHORT, UTZFMT_STYLE_EXEMPLAR_LOCATION
              break;
            }

            if (timeType) {
                *timeType = (dstOffset != 0) ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
            }
        }
    }

    return name;
}